

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Model * google::protobuf::internal::GenericTypeHandler<CoreML::Specification::Model>::New
                  (Arena *arena)

{
  Arena *arena_local;
  Model *local_28;
  Model *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (Model *)operator_new(0x30);
    CoreML::Specification::Model::Model(local_28);
  }
  else {
    local_28 = (Model *)Arena::AllocateAligned
                                  (arena,(type_info *)&CoreML::Specification::Model::typeinfo,0x30);
    CoreML::Specification::Model::Model(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::Model>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }